

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::Module::removeMemories(Module *this,function<bool_(wasm::Memory_*)> *pred)

{
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<bool_(wasm::Memory_*)>::function((function<bool_(wasm::Memory_*)> *)&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
            (&this->memories,&this->memoriesMap,(function<bool_(wasm::Memory_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void Module::removeMemories(std::function<bool(Memory*)> pred) {
  removeModuleElements(memories, memoriesMap, pred);
}